

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompressDXT.cpp
# Opt level: O2

void __thiscall
nv::SlowCompressor::compressDXT5
          (SlowCompressor *this,Private *compressionOptions,Private *outputOptions)

{
  OutputHandler *pOVar1;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint x;
  uint uVar6;
  anon_union_4_2_12391d8d_for_Color32_0 local_5a4;
  Private *local_5a0;
  SlowCompressor *local_598;
  Private *local_590;
  BlockDXT5 block;
  ColorBlock rgba;
  WeightedClusterFit fit;
  ColourSet colours;
  
  local_590 = outputOptions;
  uVar3 = Image::width(this->m_image);
  local_598 = this;
  uVar4 = Image::height(this->m_image);
  ColorBlock::ColorBlock(&rgba);
  squish::WeightedClusterFit::WeightedClusterFit(&fit);
  local_5a0 = compressionOptions;
  squish::WeightedClusterFit::SetMetric
            (&fit,(compressionOptions->colorWeight).m_x,(compressionOptions->colorWeight).m_y,
             (compressionOptions->colorWeight).m_z);
  for (uVar5 = 0; uVar5 < uVar4; uVar5 = uVar5 + 4) {
    for (uVar6 = 0; uVar6 < uVar3; uVar6 = uVar6 + 4) {
      ColorBlock::init(&rgba,(EVP_PKEY_CTX *)local_598->m_image);
      if (local_5a0->quality == Quality_Highest) {
        OptimalCompress::compressDXT5A(&rgba,&block.alpha);
      }
      else {
        QuickCompress::compressDXT5A(&rgba,&block.alpha,8);
      }
      bVar2 = ColorBlock::isSingleColor(&rgba);
      if (bVar2) {
        local_5a4 = rgba.m_color[0].field_0;
        OptimalCompress::compressDXT1((Color32 *)&local_5a4.field_0,&block.color);
      }
      else {
        squish::ColourSet::ColourSet(&colours,(u8 *)&rgba,0x80,false);
        squish::WeightedClusterFit::SetColourSet(&fit,&colours,0);
        squish::ColourFit::Compress(&fit.super_ColourFit,&block.color);
      }
      pOVar1 = local_590->outputHandler;
      if (pOVar1 != (OutputHandler *)0x0) {
        (*pOVar1->_vptr_OutputHandler[3])(pOVar1,&block,0x10);
      }
    }
  }
  return;
}

Assistant:

void nv::SlowCompressor::compressDXT5(const CompressionOptions::Private & compressionOptions, const OutputOptions::Private & outputOptions)
{
	const uint w = m_image->width();
	const uint h = m_image->height();
	
	ColorBlock rgba;
	BlockDXT5 block;

	squish::WeightedClusterFit fit;
	fit.SetMetric(compressionOptions.colorWeight.x(), compressionOptions.colorWeight.y(), compressionOptions.colorWeight.z());

	for (uint y = 0; y < h; y += 4) {
		for (uint x = 0; x < w; x += 4) {
			
			rgba.init(m_image, x, y);

			// Compress alpha.
			if (compressionOptions.quality == Quality_Highest)
			{
				OptimalCompress::compressDXT5A(rgba, &block.alpha);
			}
			else
			{
				QuickCompress::compressDXT5A(rgba, &block.alpha);
			}
		
			// Compress color.
			if (rgba.isSingleColor())
			{
				OptimalCompress::compressDXT1(rgba.color(0), &block.color);
			}
			else
			{
				squish::ColourSet colours((uint8 *)rgba.colors(), squish::kWeightColourByAlpha);
				fit.SetColourSet(&colours, 0);
				fit.Compress(&block.color);
			}
			
			if (outputOptions.outputHandler != NULL) {
				outputOptions.outputHandler->writeData(&block, sizeof(block));
			}
		}
	}
}